

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O0

size_t __thiscall DSectorMarker::PropagateMark(DSectorMarker *this)

{
  bool bVar1;
  bool bVar2;
  sector_t_conflict *psVar3;
  side_t *psVar4;
  int iVar5;
  int local_3c;
  int j_1;
  side_t *side;
  int j;
  sector_t *sec;
  int local_18;
  int iStack_14;
  bool moretodo;
  int marked;
  int i;
  DSectorMarker *this_local;
  
  local_18 = 0;
  bVar1 = false;
  if (sectors != (sector_t_conflict *)0x0) {
    iStack_14 = 0;
    while( true ) {
      psVar3 = sectors;
      bVar1 = false;
      if (iStack_14 < 0x20) {
        bVar1 = *(int *)&(this->super_DObject).field_0x24 + iStack_14 < numsectors;
      }
      if (!bVar1) break;
      iVar5 = *(int *)&(this->super_DObject).field_0x24 + iStack_14;
      GC::Mark<AActor>(&sectors[iVar5].SoundTarget);
      GC::Mark<ASectorAction>(&psVar3[iVar5].SecActTarget);
      GC::Mark<DSectorEffect>(&psVar3[iVar5].floordata);
      GC::Mark<DSectorEffect>(&psVar3[iVar5].ceilingdata);
      GC::Mark<DSectorEffect>(&psVar3[iVar5].lightingdata);
      for (side._4_4_ = 0; side._4_4_ < 4; side._4_4_ = side._4_4_ + 1) {
        GC::Mark<DInterpolation>(psVar3[iVar5].interpolations + side._4_4_);
      }
      iStack_14 = iStack_14 + 1;
    }
    local_18 = iStack_14 * 0x218;
    bVar1 = *(int *)&(this->super_DObject).field_0x24 + iStack_14 < numsectors;
    if (bVar1) {
      *(int *)&(this->super_DObject).field_0x24 =
           iStack_14 + *(int *)&(this->super_DObject).field_0x24;
    }
  }
  if ((!bVar1) && (polyobjs != (FPolyObj *)0x0)) {
    iStack_14 = 0;
    while( true ) {
      bVar2 = false;
      if (iStack_14 < 0x78) {
        bVar2 = this->PolyNum + iStack_14 < po_NumPolyobjs;
      }
      if (!bVar2) break;
      GC::Mark<DInterpolation>(&polyobjs[this->PolyNum + iStack_14].interpolation);
      iStack_14 = iStack_14 + 1;
    }
    local_18 = local_18 + iStack_14 * 0xf0;
    if (this->PolyNum + iStack_14 < po_NumPolyobjs) {
      this->PolyNum = iStack_14 + this->PolyNum;
      bVar1 = true;
    }
  }
  if ((!bVar1) && (sides != (side_t *)0x0)) {
    iStack_14 = 0;
    while( true ) {
      psVar4 = sides;
      bVar2 = false;
      if (iStack_14 < 0xf0) {
        bVar2 = this->SideNum + iStack_14 < numsides;
      }
      if (!bVar2) break;
      iVar5 = this->SideNum;
      for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
        GC::Mark<DInterpolation>(&psVar4[iVar5 + iStack_14].textures[local_3c].interpolation);
      }
      iStack_14 = iStack_14 + 1;
    }
    local_18 = local_18 + iStack_14 * 0xc0;
    if (this->SideNum + iStack_14 < numsides) {
      this->SideNum = iStack_14 + this->SideNum;
      bVar1 = true;
    }
  }
  if (bVar1) {
    DObject::Black2Gray(&this->super_DObject);
    (this->super_DObject).GCNext = &GC::Gray->super_DObject;
    GC::Gray = this;
  }
  return (long)local_18;
}

Assistant:

size_t DSectorMarker::PropagateMark()
{
	int i;
	int marked = 0;
	bool moretodo = false;

	if (sectors != NULL)
	{
		for (i = 0; i < SECTORSTEPSIZE && SecNum + i < numsectors; ++i)
		{
			sector_t *sec = &sectors[SecNum + i];
			GC::Mark(sec->SoundTarget);
			GC::Mark(sec->SecActTarget);
			GC::Mark(sec->floordata);
			GC::Mark(sec->ceilingdata);
			GC::Mark(sec->lightingdata);
			for(int j=0;j<4;j++) GC::Mark(sec->interpolations[j]);
		}
		marked += i * sizeof(sector_t);
		if (SecNum + i < numsectors)
		{
			SecNum += i;
			moretodo = true;
		}
	}
	if (!moretodo && polyobjs != NULL)
	{
		for (i = 0; i < POLYSTEPSIZE && PolyNum + i < po_NumPolyobjs; ++i)
		{
			GC::Mark(polyobjs[PolyNum + i].interpolation);
		}
		marked += i * sizeof(FPolyObj);
		if (PolyNum + i < po_NumPolyobjs)
		{
			PolyNum += i;
			moretodo = true;
		}
	}
	if (!moretodo && sides != NULL)
	{
		for (i = 0; i < SIDEDEFSTEPSIZE && SideNum + i < numsides; ++i)
		{
			side_t *side = &sides[SideNum + i];
			for(int j=0;j<3;j++) GC::Mark(side->textures[j].interpolation);
		}
		marked += i * sizeof(side_t);
		if (SideNum + i < numsides)
		{
			SideNum += i;
			moretodo = true;
		}
	}
	// If there are more sectors to mark, put ourself back into the gray
	// list.
	if (moretodo)
	{
		Black2Gray();
		GCNext = GC::Gray;
		GC::Gray = this;
	}
	return marked;
}